

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O2

qlonglong anon_unknown.dwarf_89ecae::qMetaTypeNumber(Private *d)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  qlonglong qVar4;
  double dVar5;
  
  iVar2 = *(int *)((*(ulong *)&d->field_0x18 & 0xfffffffffffffffc) + 0xc);
  switch(iVar2) {
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x28:
    goto switchD_002a5639_caseD_20;
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x27:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
    puVar1 = (uint *)((*(ulong *)&d->field_0x18 & 0xfffffffffffffffc) + 4);
    uVar3 = 0;
    if (*puVar1 != 0) {
      for (; (*puVar1 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
      }
    }
    qVar4 = (*(code *)(&DAT_004715ec + *(int *)(&DAT_004715ec + (ulong)uVar3 * 4)))();
    return qVar4;
  case 0x26:
    if ((d->field_0x18 & 1) != 0) {
      d = (Private *)
          ((long)&(((d->data).shared)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
                  ._q_value.super___atomic_base<int>._M_i + (long)((d->data).shared)->offset);
    }
    return (long)((float)((uint)*(float *)&d->data & 0x80000000 | (uint)DAT_004714d0) +
                 *(float *)&d->data);
  case 0x2d:
    if ((d->field_0x18 & 1) != 0) {
      d = (Private *)
          ((long)&(((d->data).shared)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
                  ._q_value.super___atomic_base<int>._M_i + (long)((d->data).shared)->offset);
    }
    dVar5 = QJsonValue::toDouble((QJsonValue *)d,0.0);
    return (long)dVar5;
  default:
    if (iVar2 == 2) {
      puVar1 = (uint *)((*(ulong *)&d->field_0x18 & 0xfffffffffffffffc) + 4);
      uVar3 = 0;
      if (*puVar1 != 0) {
        for (; (*puVar1 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      qVar4 = (*(code *)(&DAT_004715fc + *(int *)(&DAT_004715fc + (ulong)uVar3 * 4)))();
      return qVar4;
    }
    if (iVar2 == 0x35) {
      if ((d->field_0x18 & 1) != 0) {
        d = (Private *)
            ((long)&(((d->data).shared)->ref).super_QAtomicInteger<int>.
                    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i +
            (long)((d->data).shared)->offset);
      }
      iVar2 = *(int *)((long)&d->data + 0x10);
      if (iVar2 == 0x202) {
        return (long)(d->data)._forAlignment;
      }
      if (iVar2 != 0) {
        return 0;
      }
      return (qlonglong)(d->data).shared;
    }
    if (iVar2 == 6) {
      if ((d->field_0x18 & 1) != 0) {
        d = (Private *)
            ((long)&(((d->data).shared)->ref).super_QAtomicInteger<int>.
                    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i +
            (long)((d->data).shared)->offset);
      }
      return (long)((double)((ulong)(d->data)._forAlignment & 0x8000000000000000 |
                            (ulong)DAT_0046d920) + (d->data)._forAlignment);
    }
switchD_002a5639_caseD_20:
    qVar4 = qMetaTypeNumberBySize(d);
    return qVar4;
  }
}

Assistant:

inline const QtPrivate::QMetaTypeInterface *typeInterface() const
        {
            return reinterpret_cast<const QtPrivate::QMetaTypeInterface *>(packedType << 2);
        }